

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vmsummbm_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,
                        ppc_avr_t *c)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  int32_t prod [16];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    prod[lVar2] = (uint)b->u8[lVar2] * (int)a->s8[lVar2];
  }
  uVar3 = 0xc;
  for (uVar1 = 3; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    r->u32[uVar1] =
         prod[(ulong)uVar3 + 3] + prod[(ulong)uVar3 + 1] + prod[(ulong)uVar3 + 2] + prod[uVar3] +
         c->u32[uVar1];
    uVar3 = uVar3 - 4;
  }
  return;
}

Assistant:

void helper_vmsummbm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[16];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->s8); i++) {
        prod[i] = (int32_t)a->s8[i] * b->u8[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        r->s32[i] = c->s32[i] + prod[4 * i] + prod[4 * i + 1] +
            prod[4 * i + 2] + prod[4 * i + 3];
    }
}